

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O0

int pt_evt_to_user(pt_event *uev,size_t size,pt_event *ev)

{
  pt_event *ev_local;
  size_t size_local;
  pt_event *uev_local;
  
  if ((uev == (pt_event *)0x0) || (ev == (pt_event *)0x0)) {
    uev_local._4_4_ = -1;
  }
  else {
    ev_local = (pt_event *)size;
    if (0x48 < size) {
      memset(uev + 1,0,size - 0x48);
      ev_local = (pt_event *)0x48;
    }
    memcpy(uev,ev,(size_t)ev_local);
    uev_local._4_4_ = 0;
  }
  return uev_local._4_4_;
}

Assistant:

static inline int pt_evt_to_user(struct pt_event *uev, size_t size,
				 const struct pt_event *ev)
{
	if (!uev || !ev)
		return -pte_internal;

	/* Zero out any unknown bytes. */
	if (sizeof(*ev) < size) {
		memset(((uint8_t *) uev) + sizeof(*ev), 0, size - sizeof(*ev));

		size = sizeof(*ev);
	}

	memcpy(uev, ev, size);

	return 0;
}